

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O0

Box<Imath_2_5::Vec3<float>_> *
Imath_2_5::affineTransform<float,float>(Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m)

{
  bool bVar1;
  float *pfVar2;
  Matrix44<float> *in_RDX;
  Vec3<float> *in_RSI;
  Box<Imath_2_5::Vec3<float>_> *in_RDI;
  float fVar3;
  float fVar4;
  float b;
  float a;
  int j;
  int i;
  Box<Imath_2_5::Vec3<float>_> *newBox;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Box<Imath_2_5::Vec3<float>_> *this;
  int local_20;
  int local_1c;
  
  this = in_RDI;
  bVar1 = Box<Imath_2_5::Vec3<float>_>::isEmpty
                    ((Box<Imath_2_5::Vec3<float>_> *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if ((bVar1) || (bVar1 = Box<Imath_2_5::Vec3<float>_>::isInfinite(this), bVar1)) {
    Box<Imath_2_5::Vec3<float>_>::Box
              ((Box<Imath_2_5::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (Box<Imath_2_5::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    Box<Imath_2_5::Vec3<float>_>::Box
              ((Box<Imath_2_5::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      pfVar2 = Matrix44<float>::operator[](in_RDX,3);
      fVar3 = pfVar2[local_1c];
      pfVar2 = Vec3<float>::operator[](&this->max,local_1c);
      *pfVar2 = fVar3;
      pfVar2 = Vec3<float>::operator[](&this->min,local_1c);
      *pfVar2 = fVar3;
      for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
        pfVar2 = Matrix44<float>::operator[](in_RDX,local_20);
        fVar3 = pfVar2[local_1c];
        pfVar2 = Vec3<float>::operator[](in_RSI,local_20);
        fVar3 = fVar3 * *pfVar2;
        pfVar2 = Matrix44<float>::operator[](in_RDX,local_20);
        fVar4 = pfVar2[local_1c];
        pfVar2 = Vec3<float>::operator[](in_RSI + 1,local_20);
        fVar4 = fVar4 * *pfVar2;
        if (fVar4 <= fVar3) {
          pfVar2 = Vec3<float>::operator[](&this->min,local_1c);
          *pfVar2 = fVar4 + *pfVar2;
          pfVar2 = Vec3<float>::operator[](&this->max,local_1c);
          *pfVar2 = fVar3 + *pfVar2;
        }
        else {
          pfVar2 = Vec3<float>::operator[](&this->min,local_1c);
          *pfVar2 = fVar3 + *pfVar2;
          pfVar2 = Vec3<float>::operator[](&this->max,local_1c);
          *pfVar2 = fVar4 + *pfVar2;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Box< Vec3<S> >
affineTransform (const Box< Vec3<S> > &box, const Matrix44<T> &m)
{
    //
    // Transform a 3D box by a matrix whose rightmost column
    // is (0 0 0 1), and compute a new box that tightly encloses
    // the transformed box.
    //
    // As in the transform() function, above, we use James Arvo's
    // fast method.
    //

    if (box.isEmpty() || box.isInfinite())
    {
	//
	// A transformed empty or infinite box is still empty or infinite
	//

	return box;
    }

    Box< Vec3<S> > newBox;

    for (int i = 0; i < 3; i++) 
    {
	newBox.min[i] = newBox.max[i] = (S) m[3][i];

	for (int j = 0; j < 3; j++) 
	{
	    S a, b;

	    a = (S) m[j][i] * box.min[j];
	    b = (S) m[j][i] * box.max[j];

	    if (a < b) 
	    {
		newBox.min[i] += a;
		newBox.max[i] += b;
	    }
	    else 
	    {
		newBox.min[i] += b;
		newBox.max[i] += a;
	    }
	}
    }

    return newBox;
}